

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void spawn_characters(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long in_RDI;
  uint8_t x;
  uint8_t y;
  room_t room;
  characterstruct_t *in_stack_00000018;
  uint8_t iters;
  characterstruct_t *charstr;
  uint8_t map_x_clamped;
  uint8_t map_y_clamped;
  uint8_t map_x;
  uint8_t map_y;
  uint local_34;
  uint local_2c;
  char local_19;
  byte *local_18;
  
  if (*(byte *)(in_RDI + 0x691) < 8) {
    bVar1 = 0;
  }
  else {
    bVar1 = *(byte *)(in_RDI + 0x691) - 8;
  }
  if (*(byte *)(in_RDI + 0x692) < 8) {
    bVar2 = 0;
  }
  else {
    bVar2 = *(byte *)(in_RDI + 0x692) - 8;
  }
  local_18 = (byte *)(in_RDI + 0x170);
  local_19 = '\x1a';
  do {
    if (((*local_18 & 0x40) == 0) && (*(byte *)(in_RDI + 0x120) == local_18[1])) {
      if (*(byte *)(in_RDI + 0x120) == 0) {
        bVar3 = (-local_18[3] - local_18[2]) - local_18[4];
        if (bVar2 < bVar3) {
          if (bVar2 + 0x20 < 0xff) {
            local_2c = bVar2 + 0x20;
          }
          else {
            local_2c = 0xff;
          }
          if ((bVar3 <= local_2c) &&
             (bVar3 = (('@' - local_18[2]) + local_18[3]) * '\x02', bVar1 < bVar3)) {
            if (bVar1 + 0x28 < 0xff) {
              local_34 = bVar1 + 0x28;
            }
            else {
              local_34 = 0xff;
            }
            if (bVar3 <= local_34) goto LAB_00106f0f;
          }
        }
      }
      else {
LAB_00106f0f:
        spawn_character((tgestate_t *)charstr,in_stack_00000018);
      }
    }
    local_18 = local_18 + 7;
    local_19 = local_19 + -1;
    if (local_19 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void spawn_characters(tgestate_t *state)
{
  /* Size, in UDGs, of a buffer zone around the visible screen in which
   * visible characters will spawn. */
  enum { GRACE = 8 };

  uint8_t            map_y, map_x;                  /* was H, L */
  uint8_t            map_y_clamped, map_x_clamped;  /* was D, E */
  characterstruct_t *charstr;                       /* was HL */
  uint8_t            iters;                         /* was B */
  room_t             room;                          /* was A */
  uint8_t            y, x;                          /* was C, A */

  assert(state != NULL);

  /* Form a clamped map position in (map_x, map_y). */
  map_x = state->map_position.x;
  map_y = state->map_position.y;
  map_x_clamped = (map_x < GRACE) ? 0 : map_x - GRACE;
  map_y_clamped = (map_y < GRACE) ? 0 : map_y - GRACE;

  /* Walk all character structs. */
  charstr = &state->character_structs[0];
  iters   = character_structs__LIMIT;
  do
  {
    if ((charstr->character_and_flags & characterstruct_FLAG_ON_SCREEN) == 0)
    {
      /* Is this character in the current room? */
      if ((room = state->room_index) == charstr->room)
      {
        if (room == room_0_OUTDOORS)
        {
          /* Handle outdoors. */

          /* Do screen Y calculation.
           * The 0x100 here is represented as zero in the original game. */
          y = 0x100 - charstr->mappos.u - charstr->mappos.v - charstr->mappos.w;
          if (y <= map_y_clamped || // <= might need to be <
              y > MIN(map_y_clamped + GRACE + 16 + GRACE, 0xFF))
            goto skip;

          /* Do screen X calculation. */
          x = (0x40 - charstr->mappos.u + charstr->mappos.v) * 2;
          if (x <= map_x_clamped || // <= might need to be <
              x > MIN(map_x_clamped + GRACE + 24 + GRACE, 0xFF))
            goto skip;
        }

        spawn_character(state, charstr);
      }
    }

skip:
    charstr++;
  }
  while (--iters);
}